

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

void __thiscall
SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>::Clear
          (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *this)

{
  Recycler *this_00;
  SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *pSVar1;
  SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *buffer;
  
  this_00 = this->allocator;
  buffer = (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *)
           (this->super_SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>).
           super_SListNodeBase<Memory::Recycler>.next.ptr;
  while (buffer != this) {
    pSVar1 = (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *)
             (buffer->super_SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>).
             super_SListNodeBase<Memory::Recycler>.next.ptr;
    Memory::Recycler::ExplicitFreeNonLeaf(this_00,buffer,0x10);
    buffer = pSVar1;
  }
  SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>::Reset
            (&this->super_SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>);
  return;
}

Assistant:

void Clear()
    {
        __super::Clear(allocator);
    }